

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

uint64_t quicly_determine_packet_number(uint32_t truncated,size_t num_bits,uint64_t expected)

{
  ulong uVar1;
  uint64_t candidate;
  uint64_t win;
  uint64_t expected_local;
  size_t num_bits_local;
  uint32_t truncated_local;
  ulong local_8;
  
  uVar1 = 1L << ((byte)num_bits & 0x3f);
  local_8 = expected & (uVar1 - 1 ^ 0xffffffffffffffff) | (ulong)truncated;
  if (expected < local_8 + (uVar1 >> 1)) {
    if ((expected + (uVar1 >> 1) < local_8) && (uVar1 <= local_8)) {
      local_8 = local_8 - uVar1;
    }
  }
  else {
    local_8 = local_8 + uVar1;
  }
  return local_8;
}

Assistant:

uint64_t quicly_determine_packet_number(uint32_t truncated, size_t num_bits, uint64_t expected)
{
    uint64_t win = (uint64_t)1 << num_bits, candidate = (expected & ~(win - 1)) | truncated;

    if (candidate + win / 2 <= expected)
        return candidate + win;
    if (candidate > expected + win / 2 && candidate >= win)
        return candidate - win;
    return candidate;
}